

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O1

void __thiscall draco::Options::SetBool(Options *this,string *name,bool val)

{
  mapped_type *this_00;
  undefined7 in_register_00000011;
  string __str;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_48[0],1,(uint)CONCAT71(in_register_00000011,val));
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->options_,name);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

void Options::SetBool(const std::string &name, bool val) {
  options_[name] = std::to_string(val ? 1 : 0);
}